

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O1

void embree::avx::
     BVHNIntersector1<4,_16777232,_true,_embree::avx::ArrayIntersector1<embree::avx::TriangleMiMBIntersector1Pluecker<4,_true>_>_>
     ::intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  float *pfVar1;
  undefined8 *puVar2;
  float *pfVar3;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar4;
  uint uVar5;
  uint uVar6;
  Scene *pSVar7;
  Geometry *pGVar8;
  RTCIntersectArguments *pRVar9;
  RTCRayQueryContext *pRVar10;
  long lVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 (*pauVar19) [16];
  int iVar20;
  AABBNodeMB4D *node1;
  ulong uVar21;
  long lVar22;
  ulong uVar23;
  long lVar24;
  ulong uVar25;
  ulong uVar26;
  undefined4 uVar27;
  ulong uVar28;
  ulong uVar29;
  ulong uVar30;
  ulong uVar31;
  float *vertices;
  ulong uVar32;
  ulong uVar33;
  ulong uVar34;
  int *piVar35;
  float fVar45;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  float fVar43;
  float fVar44;
  undefined1 auVar42 [64];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  float fVar68;
  float fVar69;
  float fVar83;
  float fVar84;
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  float fVar85;
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  float fVar86;
  float fVar87;
  float fVar97;
  float fVar98;
  float fVar99;
  float fVar100;
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  float fVar101;
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  float fVar102;
  float fVar103;
  float fVar115;
  float fVar117;
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  float fVar119;
  undefined1 auVar109 [16];
  float fVar120;
  undefined1 auVar110 [16];
  float fVar104;
  undefined1 auVar111 [16];
  float fVar116;
  float fVar118;
  float fVar121;
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [64];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [64];
  float fVar134;
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  float fVar143;
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  float fVar141;
  float fVar142;
  undefined1 auVar140 [64];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [64];
  undefined1 auVar148 [64];
  float fVar149;
  float fVar151;
  float fVar152;
  float fVar153;
  undefined1 auVar150 [64];
  float fVar154;
  float fVar161;
  undefined1 auVar155 [16];
  float fVar157;
  float fVar158;
  float fVar159;
  float fVar160;
  float fVar162;
  undefined1 auVar156 [64];
  float fVar163;
  undefined1 auVar164 [16];
  float fVar166;
  float fVar167;
  float fVar168;
  undefined1 auVar165 [64];
  float fVar169;
  undefined1 auVar170 [16];
  float fVar175;
  undefined1 auVar171 [16];
  float fVar173;
  float fVar174;
  undefined1 auVar172 [64];
  float fVar176;
  float fVar181;
  undefined1 auVar177 [16];
  float fVar179;
  float fVar180;
  float fVar182;
  undefined1 auVar178 [64];
  UVIdentity<4> mapUV;
  vbool<4> valid;
  Scene *scene;
  RTCFilterFunctionNArguments args;
  HitK<1> h;
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  undefined1 local_12c1;
  ulong local_12c0;
  Intersectors *local_12b8;
  ulong local_12b0;
  undefined1 local_12a8 [8];
  float fStack_12a0;
  float fStack_129c;
  float local_1298;
  float fStack_1294;
  float fStack_1290;
  float fStack_128c;
  undefined1 local_1288 [16];
  int local_126c;
  undefined1 local_1268 [8];
  float fStack_1260;
  float fStack_125c;
  float local_1258;
  float fStack_1254;
  float fStack_1250;
  float fStack_124c;
  undefined1 local_1248 [16];
  Scene *local_1230;
  RTCFilterFunctionNArguments local_1228;
  undefined1 local_11f8 [8];
  float fStack_11f0;
  float fStack_11ec;
  undefined1 local_11e8 [8];
  float fStack_11e0;
  float fStack_11dc;
  ulong local_11d8;
  ulong local_11d0;
  ulong local_11c8;
  ulong local_11c0;
  ulong local_11b8;
  undefined1 (*local_11b0) [16];
  long local_11a8;
  long local_11a0;
  float local_1198;
  undefined4 local_1194;
  undefined4 local_1190;
  undefined4 local_118c;
  undefined4 local_1188;
  undefined4 local_1184;
  uint local_1180;
  uint local_117c;
  uint local_1178;
  undefined1 local_1168 [16];
  undefined8 local_1158;
  undefined8 uStack_1150;
  undefined8 local_1148;
  undefined8 uStack_1140;
  undefined1 local_1138 [16];
  undefined1 local_1128 [16];
  undefined1 local_1118 [16];
  undefined1 *local_1108;
  undefined1 local_10f8 [16];
  undefined1 local_10e8 [16];
  undefined1 local_10d8 [16];
  undefined1 local_10c8 [16];
  undefined1 local_10b8 [16];
  undefined1 local_10a8 [16];
  undefined1 local_1098 [16];
  undefined1 local_1088 [16];
  undefined1 local_1078 [16];
  undefined1 local_1068 [16];
  undefined1 local_1058 [16];
  undefined1 local_1048 [16];
  undefined1 local_1038 [16];
  undefined1 local_1028 [16];
  undefined1 local_1018 [16];
  undefined1 local_1008 [16];
  undefined1 local_ff8 [16];
  undefined1 local_fe8 [16];
  undefined1 local_fd8 [16];
  undefined1 local_fc8 [16];
  undefined1 local_fb8 [16];
  undefined1 local_fa8 [16];
  undefined1 local_f98 [16];
  undefined8 local_f88;
  undefined8 uStack_f80;
  long local_f78;
  undefined4 uStack_f70;
  undefined1 local_f68 [3896];
  
  if (*(long *)&This->ptr[1].bounds.bounds0.lower.field_0 != 8) {
    local_f78 = *(long *)&This->ptr[1].bounds.bounds0.lower.field_0;
    uStack_f70 = 0;
    if (local_f78 != 8) {
      local_11b0 = (undefined1 (*) [16])local_f68;
      aVar4 = (ray->super_RayK<1>).dir.field_0;
      auVar46 = vmaxss_avx(ZEXT816(0) << 0x40,
                           ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[3]));
      auVar114 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->super_RayK<1>).tfar));
      auVar47._8_4_ = 0x7fffffff;
      auVar47._0_8_ = 0x7fffffff7fffffff;
      auVar47._12_4_ = 0x7fffffff;
      auVar47 = vandps_avx((undefined1  [16])aVar4,auVar47);
      auVar113._8_4_ = 0x219392ef;
      auVar113._0_8_ = 0x219392ef219392ef;
      auVar113._12_4_ = 0x219392ef;
      auVar47 = vcmpps_avx(auVar47,auVar113,1);
      auVar88._8_4_ = 0x3f800000;
      auVar88._0_8_ = &DAT_3f8000003f800000;
      auVar88._12_4_ = 0x3f800000;
      auVar113 = vdivps_avx(auVar88,(undefined1  [16])aVar4);
      auVar89._8_4_ = 0x5d5e0b6b;
      auVar89._0_8_ = 0x5d5e0b6b5d5e0b6b;
      auVar89._12_4_ = 0x5d5e0b6b;
      auVar47 = vblendvps_avx(auVar113,auVar89,auVar47);
      auVar70._0_4_ = auVar47._0_4_ * 0.99999964;
      auVar70._4_4_ = auVar47._4_4_ * 0.99999964;
      auVar70._8_4_ = auVar47._8_4_ * 0.99999964;
      auVar70._12_4_ = auVar47._12_4_ * 0.99999964;
      auVar57._0_4_ = auVar47._0_4_ * 1.0000004;
      auVar57._4_4_ = auVar47._4_4_ * 1.0000004;
      auVar57._8_4_ = auVar47._8_4_ * 1.0000004;
      auVar57._12_4_ = auVar47._12_4_ * 1.0000004;
      uVar27 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
      local_1008._4_4_ = uVar27;
      local_1008._0_4_ = uVar27;
      local_1008._8_4_ = uVar27;
      local_1008._12_4_ = uVar27;
      auVar133 = ZEXT1664(local_1008);
      uVar27 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 4);
      local_1018._4_4_ = uVar27;
      local_1018._0_4_ = uVar27;
      local_1018._8_4_ = uVar27;
      local_1018._12_4_ = uVar27;
      auVar140 = ZEXT1664(local_1018);
      uVar27 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 8);
      local_1028._4_4_ = uVar27;
      local_1028._0_4_ = uVar27;
      local_1028._8_4_ = uVar27;
      local_1028._12_4_ = uVar27;
      auVar147 = ZEXT1664(local_1028);
      local_1038 = vshufps_avx(auVar70,auVar70,0);
      auVar148 = ZEXT1664(local_1038);
      auVar47 = vmovshdup_avx(auVar70);
      local_1048 = vshufps_avx(auVar70,auVar70,0x55);
      auVar150 = ZEXT1664(local_1048);
      auVar113 = vshufpd_avx(auVar70,auVar70,1);
      local_1058 = vshufps_avx(auVar70,auVar70,0xaa);
      auVar156 = ZEXT1664(local_1058);
      local_1068 = vshufps_avx(auVar57,auVar57,0);
      auVar165 = ZEXT1664(local_1068);
      local_11b8 = (ulong)(auVar70._0_4_ < 0.0) << 4;
      local_1078 = vshufps_avx(auVar57,auVar57,0x55);
      auVar172 = ZEXT1664(local_1078);
      local_1088 = vshufps_avx(auVar57,auVar57,0xaa);
      auVar178 = ZEXT1664(local_1088);
      local_11c0 = (ulong)(auVar47._0_4_ < 0.0) << 4 | 0x20;
      local_11c8 = (ulong)(auVar113._0_4_ < 0.0) << 4 | 0x40;
      local_12b0 = local_11c8 ^ 0x10;
      local_1168 = vshufps_avx(auVar46,auVar46,0);
      auVar126 = ZEXT1664(local_1168);
      auVar47 = vshufps_avx(auVar114,auVar114,0);
      auVar42 = ZEXT1664(auVar47);
      local_1158 = mm_lookupmask_ps._240_8_;
      uStack_1150 = mm_lookupmask_ps._248_8_;
      local_11d0 = local_11b8 ^ 0x10;
      local_11d8 = local_11c0 ^ 0x10;
      uVar23 = local_11c0;
      uVar25 = local_11c0 ^ 0x10;
      uVar26 = local_12b0;
      uVar29 = local_11b8;
      uVar30 = local_11b8 ^ 0x10;
      uVar31 = local_11c8;
      do {
        do {
          do {
            if (local_11b0 == (undefined1 (*) [16])&local_f78) {
              return;
            }
            pauVar19 = local_11b0 + -1;
            local_11b0 = local_11b0 + -1;
          } while ((ray->super_RayK<1>).tfar < *(float *)(*pauVar19 + 8));
          local_12c0 = *(ulong *)*local_11b0;
          do {
            if ((local_12c0 & 8) == 0) {
              uVar21 = local_12c0 & 0xfffffffffffffff0;
              fVar86 = (ray->super_RayK<1>).dir.field_0.m128[3];
              auVar46._4_4_ = fVar86;
              auVar46._0_4_ = fVar86;
              auVar46._8_4_ = fVar86;
              auVar46._12_4_ = fVar86;
              pfVar3 = (float *)(uVar21 + 0x80 + uVar29);
              pfVar1 = (float *)(uVar21 + 0x20 + uVar29);
              auVar114._0_4_ = fVar86 * *pfVar3 + *pfVar1;
              auVar114._4_4_ = fVar86 * pfVar3[1] + pfVar1[1];
              auVar114._8_4_ = fVar86 * pfVar3[2] + pfVar1[2];
              auVar114._12_4_ = fVar86 * pfVar3[3] + pfVar1[3];
              auVar47 = vsubps_avx(auVar114,auVar133._0_16_);
              auVar58._0_4_ = auVar148._0_4_ * auVar47._0_4_;
              auVar58._4_4_ = auVar148._4_4_ * auVar47._4_4_;
              auVar58._8_4_ = auVar148._8_4_ * auVar47._8_4_;
              auVar58._12_4_ = auVar148._12_4_ * auVar47._12_4_;
              auVar47 = vmaxps_avx(auVar126._0_16_,auVar58);
              pfVar3 = (float *)(uVar21 + 0x80 + uVar23);
              pfVar1 = (float *)(uVar21 + 0x20 + uVar23);
              auVar71._0_4_ = fVar86 * *pfVar3 + *pfVar1;
              auVar71._4_4_ = fVar86 * pfVar3[1] + pfVar1[1];
              auVar71._8_4_ = fVar86 * pfVar3[2] + pfVar1[2];
              auVar71._12_4_ = fVar86 * pfVar3[3] + pfVar1[3];
              auVar113 = vsubps_avx(auVar71,auVar140._0_16_);
              auVar72._0_4_ = auVar150._0_4_ * auVar113._0_4_;
              auVar72._4_4_ = auVar150._4_4_ * auVar113._4_4_;
              auVar72._8_4_ = auVar150._8_4_ * auVar113._8_4_;
              auVar72._12_4_ = auVar150._12_4_ * auVar113._12_4_;
              pfVar3 = (float *)(uVar21 + 0x80 + uVar31);
              pfVar1 = (float *)(uVar21 + 0x20 + uVar31);
              auVar90._0_4_ = fVar86 * *pfVar3 + *pfVar1;
              auVar90._4_4_ = fVar86 * pfVar3[1] + pfVar1[1];
              auVar90._8_4_ = fVar86 * pfVar3[2] + pfVar1[2];
              auVar90._12_4_ = fVar86 * pfVar3[3] + pfVar1[3];
              auVar113 = vsubps_avx(auVar90,auVar147._0_16_);
              auVar91._0_4_ = auVar156._0_4_ * auVar113._0_4_;
              auVar91._4_4_ = auVar156._4_4_ * auVar113._4_4_;
              auVar91._8_4_ = auVar156._8_4_ * auVar113._8_4_;
              auVar91._12_4_ = auVar156._12_4_ * auVar113._12_4_;
              auVar113 = vmaxps_avx(auVar72,auVar91);
              local_1138 = vmaxps_avx(auVar47,auVar113);
              pfVar3 = (float *)(uVar21 + 0x80 + uVar30);
              pfVar1 = (float *)(uVar21 + 0x20 + uVar30);
              auVar73._0_4_ = fVar86 * *pfVar3 + *pfVar1;
              auVar73._4_4_ = fVar86 * pfVar3[1] + pfVar1[1];
              auVar73._8_4_ = fVar86 * pfVar3[2] + pfVar1[2];
              auVar73._12_4_ = fVar86 * pfVar3[3] + pfVar1[3];
              auVar47 = vsubps_avx(auVar73,auVar133._0_16_);
              auVar74._0_4_ = auVar165._0_4_ * auVar47._0_4_;
              auVar74._4_4_ = auVar165._4_4_ * auVar47._4_4_;
              auVar74._8_4_ = auVar165._8_4_ * auVar47._8_4_;
              auVar74._12_4_ = auVar165._12_4_ * auVar47._12_4_;
              pfVar3 = (float *)(uVar21 + 0x80 + uVar25);
              pfVar1 = (float *)(uVar21 + 0x20 + uVar25);
              auVar92._0_4_ = fVar86 * *pfVar3 + *pfVar1;
              auVar92._4_4_ = fVar86 * pfVar3[1] + pfVar1[1];
              auVar92._8_4_ = fVar86 * pfVar3[2] + pfVar1[2];
              auVar92._12_4_ = fVar86 * pfVar3[3] + pfVar1[3];
              auVar47 = vsubps_avx(auVar92,auVar140._0_16_);
              auVar93._0_4_ = auVar172._0_4_ * auVar47._0_4_;
              auVar93._4_4_ = auVar172._4_4_ * auVar47._4_4_;
              auVar93._8_4_ = auVar172._8_4_ * auVar47._8_4_;
              auVar93._12_4_ = auVar172._12_4_ * auVar47._12_4_;
              pfVar3 = (float *)(uVar21 + 0x80 + uVar26);
              pfVar1 = (float *)(uVar21 + 0x20 + uVar26);
              auVar105._0_4_ = fVar86 * *pfVar3 + *pfVar1;
              auVar105._4_4_ = fVar86 * pfVar3[1] + pfVar1[1];
              auVar105._8_4_ = fVar86 * pfVar3[2] + pfVar1[2];
              auVar105._12_4_ = fVar86 * pfVar3[3] + pfVar1[3];
              auVar47 = vsubps_avx(auVar105,auVar147._0_16_);
              auVar106._0_4_ = auVar178._0_4_ * auVar47._0_4_;
              auVar106._4_4_ = auVar178._4_4_ * auVar47._4_4_;
              auVar106._8_4_ = auVar178._8_4_ * auVar47._8_4_;
              auVar106._12_4_ = auVar178._12_4_ * auVar47._12_4_;
              auVar47 = vminps_avx(auVar93,auVar106);
              auVar113 = vminps_avx(auVar42._0_16_,auVar74);
              auVar47 = vminps_avx(auVar113,auVar47);
              if (((uint)local_12c0 & 7) == 6) {
                auVar113 = vcmpps_avx(local_1138,auVar47,2);
                auVar47 = vcmpps_avx(*(undefined1 (*) [16])(uVar21 + 0xe0),auVar46,2);
                auVar46 = vcmpps_avx(auVar46,*(undefined1 (*) [16])(uVar21 + 0xf0),1);
                auVar47 = vandps_avx(auVar47,auVar46);
                auVar47 = vandps_avx(auVar47,auVar113);
              }
              else {
                auVar47 = vcmpps_avx(local_1138,auVar47,2);
              }
              auVar47 = vpslld_avx(auVar47,0x1f);
              uVar27 = vmovmskps_avx(auVar47);
              This = (Intersectors *)CONCAT44((int)((ulong)This >> 0x20),uVar27);
            }
            if ((local_12c0 & 8) == 0) {
              if (This == (Intersectors *)0x0) {
                iVar20 = 4;
              }
              else {
                uVar21 = local_12c0 & 0xfffffffffffffff0;
                lVar11 = 0;
                if (This != (Intersectors *)0x0) {
                  for (; ((ulong)This >> lVar11 & 1) == 0; lVar11 = lVar11 + 1) {
                  }
                }
                iVar20 = 0;
                local_12c0 = *(ulong *)(uVar21 + lVar11 * 8);
                uVar28 = (ulong)((long)&This[-1].intersector16_nofilter.name + 7U) & (ulong)This;
                if (uVar28 != 0) {
                  uVar6 = *(uint *)(local_1138 + lVar11 * 4);
                  lVar11 = 0;
                  if (uVar28 != 0) {
                    for (; (uVar28 >> lVar11 & 1) == 0; lVar11 = lVar11 + 1) {
                    }
                  }
                  uVar32 = *(ulong *)(uVar21 + lVar11 * 8);
                  uVar5 = *(uint *)(local_1138 + lVar11 * 4);
                  uVar28 = uVar28 - 1 & uVar28;
                  uVar26 = local_12b0;
                  if (uVar28 == 0) {
                    if (uVar6 < uVar5) {
                      *(ulong *)*local_11b0 = uVar32;
                      *(uint *)(*local_11b0 + 8) = uVar5;
                      local_11b0 = local_11b0 + 1;
                    }
                    else {
                      *(ulong *)*local_11b0 = local_12c0;
                      *(uint *)(*local_11b0 + 8) = uVar6;
                      local_12c0 = uVar32;
                      local_11b0 = local_11b0 + 1;
                    }
                  }
                  else {
                    auVar48._8_8_ = 0;
                    auVar48._0_8_ = local_12c0;
                    auVar47 = vpunpcklqdq_avx(auVar48,ZEXT416(uVar6));
                    auVar59._8_8_ = 0;
                    auVar59._0_8_ = uVar32;
                    auVar113 = vpunpcklqdq_avx(auVar59,ZEXT416(uVar5));
                    lVar11 = 0;
                    if (uVar28 != 0) {
                      for (; (uVar28 >> lVar11 & 1) == 0; lVar11 = lVar11 + 1) {
                      }
                    }
                    auVar75._8_8_ = 0;
                    auVar75._0_8_ = *(ulong *)(uVar21 + lVar11 * 8);
                    auVar114 = vpunpcklqdq_avx(auVar75,ZEXT416(*(uint *)(local_1138 + lVar11 * 4)));
                    auVar46 = vpcmpgtd_avx(auVar113,auVar47);
                    uVar28 = uVar28 - 1 & uVar28;
                    if (uVar28 == 0) {
                      auVar57 = vpshufd_avx(auVar46,0xaa);
                      auVar46 = vblendvps_avx(auVar113,auVar47,auVar57);
                      auVar47 = vblendvps_avx(auVar47,auVar113,auVar57);
                      auVar113 = vpcmpgtd_avx(auVar114,auVar46);
                      auVar57 = vpshufd_avx(auVar113,0xaa);
                      auVar113 = vblendvps_avx(auVar114,auVar46,auVar57);
                      auVar46 = vblendvps_avx(auVar46,auVar114,auVar57);
                      auVar114 = vpcmpgtd_avx(auVar46,auVar47);
                      auVar57 = vpshufd_avx(auVar114,0xaa);
                      auVar114 = vblendvps_avx(auVar46,auVar47,auVar57);
                      auVar47 = vblendvps_avx(auVar47,auVar46,auVar57);
                      *local_11b0 = auVar47;
                      local_11b0[1] = auVar114;
                      local_12c0 = auVar113._0_8_;
                      local_11b0 = local_11b0 + 2;
                    }
                    else {
                      lVar11 = 0;
                      if (uVar28 != 0) {
                        for (; (uVar28 >> lVar11 & 1) == 0; lVar11 = lVar11 + 1) {
                        }
                      }
                      auVar107._8_8_ = 0;
                      auVar107._0_8_ = *(ulong *)(uVar21 + lVar11 * 8);
                      auVar70 = vpunpcklqdq_avx(auVar107,ZEXT416(*(uint *)(local_1138 + lVar11 * 4))
                                               );
                      auVar57 = vpshufd_avx(auVar46,0xaa);
                      auVar46 = vblendvps_avx(auVar113,auVar47,auVar57);
                      auVar47 = vblendvps_avx(auVar47,auVar113,auVar57);
                      auVar113 = vpcmpgtd_avx(auVar70,auVar114);
                      auVar57 = vpshufd_avx(auVar113,0xaa);
                      auVar113 = vblendvps_avx(auVar70,auVar114,auVar57);
                      auVar114 = vblendvps_avx(auVar114,auVar70,auVar57);
                      auVar57 = vpcmpgtd_avx(auVar114,auVar47);
                      auVar70 = vpshufd_avx(auVar57,0xaa);
                      auVar57 = vblendvps_avx(auVar114,auVar47,auVar70);
                      auVar47 = vblendvps_avx(auVar47,auVar114,auVar70);
                      auVar114 = vpcmpgtd_avx(auVar113,auVar46);
                      auVar70 = vpshufd_avx(auVar114,0xaa);
                      auVar114 = vblendvps_avx(auVar113,auVar46,auVar70);
                      auVar113 = vblendvps_avx(auVar46,auVar113,auVar70);
                      auVar46 = vpcmpgtd_avx(auVar57,auVar113);
                      auVar70 = vpshufd_avx(auVar46,0xaa);
                      auVar46 = vblendvps_avx(auVar57,auVar113,auVar70);
                      auVar113 = vblendvps_avx(auVar113,auVar57,auVar70);
                      *local_11b0 = auVar47;
                      local_11b0[1] = auVar113;
                      local_11b0[2] = auVar46;
                      auVar126 = ZEXT1664(local_1168);
                      local_12c0 = auVar114._0_8_;
                      local_11b0 = local_11b0 + 3;
                    }
                  }
                }
              }
            }
            else {
              iVar20 = 6;
            }
          } while (iVar20 == 0);
        } while (iVar20 != 6);
        local_11a8 = (ulong)((uint)local_12c0 & 0xf) - 8;
        local_12b8 = This;
        if (local_11a8 != 0) {
          local_12c0 = local_12c0 & 0xfffffffffffffff0;
          local_11a0 = 0;
          do {
            lVar22 = local_11a0 * 0x50;
            pSVar7 = context->scene;
            local_1230 = pSVar7;
            pGVar8 = (pSVar7->geometries).items[*(uint *)(local_12c0 + 0x30 + lVar22)].ptr;
            fVar86 = (pGVar8->time_range).lower;
            fVar86 = pGVar8->fnumTimeSegments *
                     (((ray->super_RayK<1>).dir.field_0.m128[3] - fVar86) /
                     ((pGVar8->time_range).upper - fVar86));
            auVar47 = vroundss_avx(ZEXT416((uint)fVar86),ZEXT416((uint)fVar86),9);
            auVar47 = vminss_avx(auVar47,ZEXT416((uint)(pGVar8->fnumTimeSegments + -1.0)));
            auVar74 = vmaxss_avx(ZEXT816(0),auVar47);
            lVar24 = (long)(int)auVar74._0_4_ * 0x38;
            uVar34 = (ulong)*(uint *)(local_12c0 + 4 + lVar22);
            lVar11 = *(long *)(*(long *)&pGVar8[2].numPrimitives + lVar24);
            lVar24 = *(long *)(*(long *)&pGVar8[2].numPrimitives + 0x38 + lVar24);
            auVar47 = *(undefined1 (*) [16])(lVar11 + (ulong)*(uint *)(local_12c0 + lVar22) * 4);
            uVar33 = (ulong)*(uint *)(local_12c0 + 0x10 + lVar22);
            auVar113 = *(undefined1 (*) [16])(lVar11 + uVar33 * 4);
            uVar25 = (ulong)*(uint *)(local_12c0 + 0x20 + lVar22);
            auVar93 = *(undefined1 (*) [16])(lVar11 + uVar25 * 4);
            auVar46 = *(undefined1 (*) [16])(lVar11 + uVar34 * 4);
            uVar26 = (ulong)*(uint *)(local_12c0 + 0x14 + lVar22);
            auVar114 = *(undefined1 (*) [16])(lVar11 + uVar26 * 4);
            uVar29 = (ulong)*(uint *)(local_12c0 + 0x24 + lVar22);
            auVar105 = *(undefined1 (*) [16])(lVar11 + uVar29 * 4);
            uVar32 = (ulong)*(uint *)(local_12c0 + 8 + lVar22);
            auVar57 = *(undefined1 (*) [16])(lVar11 + uVar32 * 4);
            uVar21 = (ulong)*(uint *)(local_12c0 + 0x18 + lVar22);
            auVar70 = *(undefined1 (*) [16])(lVar11 + uVar21 * 4);
            uVar30 = (ulong)*(uint *)(local_12c0 + 0x28 + lVar22);
            auVar88 = *(undefined1 (*) [16])(lVar11 + uVar30 * 4);
            uVar23 = (ulong)*(uint *)(local_12c0 + 0xc + lVar22);
            auVar89 = *(undefined1 (*) [16])(lVar11 + uVar23 * 4);
            uVar28 = (ulong)*(uint *)(local_12c0 + 0x1c + lVar22);
            auVar58 = *(undefined1 (*) [16])(lVar11 + uVar28 * 4);
            uVar31 = (ulong)*(uint *)(local_12c0 + 0x2c + lVar22);
            auVar71 = *(undefined1 (*) [16])(lVar11 + uVar31 * 4);
            auVar72 = *(undefined1 (*) [16])(lVar24 + (ulong)*(uint *)(local_12c0 + lVar22) * 4);
            auVar73 = *(undefined1 (*) [16])(lVar24 + uVar33 * 4);
            fVar86 = fVar86 - auVar74._0_4_;
            auVar74 = vunpcklps_avx(auVar47,auVar57);
            auVar57 = vunpckhps_avx(auVar47,auVar57);
            auVar90 = vunpcklps_avx(auVar46,auVar89);
            auVar46 = vunpckhps_avx(auVar46,auVar89);
            auVar47 = *(undefined1 (*) [16])(lVar24 + uVar34 * 4);
            auVar91 = vunpcklps_avx(auVar57,auVar46);
            auVar92 = vunpcklps_avx(auVar74,auVar90);
            auVar57 = vunpckhps_avx(auVar74,auVar90);
            auVar89 = vunpcklps_avx(auVar113,auVar70);
            auVar46 = vunpckhps_avx(auVar113,auVar70);
            auVar70 = vunpcklps_avx(auVar114,auVar58);
            auVar114 = vunpckhps_avx(auVar114,auVar58);
            auVar113 = *(undefined1 (*) [16])(lVar24 + uVar32 * 4);
            auVar58 = vunpcklps_avx(auVar46,auVar114);
            auVar74 = vunpcklps_avx(auVar89,auVar70);
            auVar114 = vunpckhps_avx(auVar89,auVar70);
            auVar89 = vunpcklps_avx(auVar93,auVar88);
            auVar70 = vunpckhps_avx(auVar93,auVar88);
            auVar90 = vunpcklps_avx(auVar105,auVar71);
            auVar88 = vunpckhps_avx(auVar105,auVar71);
            auVar46 = *(undefined1 (*) [16])(lVar24 + uVar23 * 4);
            auVar71 = vunpcklps_avx(auVar70,auVar88);
            auVar93 = vunpcklps_avx(auVar89,auVar90);
            auVar70 = vunpckhps_avx(auVar89,auVar90);
            auVar88 = vunpcklps_avx(auVar72,auVar113);
            auVar113 = vunpckhps_avx(auVar72,auVar113);
            auVar89 = vunpcklps_avx(auVar47,auVar46);
            auVar46 = vunpckhps_avx(auVar47,auVar46);
            auVar47 = *(undefined1 (*) [16])(lVar24 + uVar21 * 4);
            auVar72 = vunpcklps_avx(auVar113,auVar46);
            auVar90 = vunpcklps_avx(auVar88,auVar89);
            auVar46 = vunpckhps_avx(auVar88,auVar89);
            auVar89 = vunpcklps_avx(auVar73,auVar47);
            auVar88 = vunpckhps_avx(auVar73,auVar47);
            auVar47 = *(undefined1 (*) [16])(lVar24 + uVar26 * 4);
            auVar113 = *(undefined1 (*) [16])(lVar24 + uVar28 * 4);
            auVar73 = vunpcklps_avx(auVar47,auVar113);
            auVar47 = vunpckhps_avx(auVar47,auVar113);
            auVar105 = vunpcklps_avx(auVar88,auVar47);
            auVar106 = vunpcklps_avx(auVar89,auVar73);
            auVar88 = vunpckhps_avx(auVar89,auVar73);
            auVar47 = *(undefined1 (*) [16])(lVar24 + uVar25 * 4);
            auVar113 = *(undefined1 (*) [16])(lVar24 + uVar30 * 4);
            auVar73 = vunpcklps_avx(auVar47,auVar113);
            auVar89 = vunpckhps_avx(auVar47,auVar113);
            auVar47 = *(undefined1 (*) [16])(lVar24 + uVar29 * 4);
            auVar113 = *(undefined1 (*) [16])(lVar24 + uVar31 * 4);
            auVar48 = vunpcklps_avx(auVar47,auVar113);
            auVar47 = vunpckhps_avx(auVar47,auVar113);
            auVar59 = vunpcklps_avx(auVar89,auVar47);
            auVar75 = vunpcklps_avx(auVar73,auVar48);
            auVar89 = vunpckhps_avx(auVar73,auVar48);
            auVar47 = vshufps_avx(ZEXT416((uint)fVar86),ZEXT416((uint)fVar86),0);
            auVar113 = vshufps_avx(ZEXT416((uint)(1.0 - fVar86)),ZEXT416((uint)(1.0 - fVar86)),0);
            fVar116 = auVar47._0_4_;
            fVar118 = auVar47._4_4_;
            fVar121 = auVar47._8_4_;
            fVar181 = auVar47._12_4_;
            fVar86 = auVar113._0_4_;
            fVar157 = auVar113._4_4_;
            fVar159 = auVar113._8_4_;
            fVar161 = auVar113._12_4_;
            auVar122._0_4_ = fVar86 * auVar92._0_4_ + fVar116 * auVar90._0_4_;
            auVar122._4_4_ = fVar157 * auVar92._4_4_ + fVar118 * auVar90._4_4_;
            auVar122._8_4_ = fVar159 * auVar92._8_4_ + fVar121 * auVar90._8_4_;
            auVar122._12_4_ = fVar161 * auVar92._12_4_ + fVar181 * auVar90._12_4_;
            auVar127._0_4_ = fVar86 * auVar57._0_4_ + fVar116 * auVar46._0_4_;
            auVar127._4_4_ = fVar157 * auVar57._4_4_ + fVar118 * auVar46._4_4_;
            auVar127._8_4_ = fVar159 * auVar57._8_4_ + fVar121 * auVar46._8_4_;
            auVar127._12_4_ = fVar161 * auVar57._12_4_ + fVar181 * auVar46._12_4_;
            local_11f8._0_4_ = auVar91._0_4_;
            local_11f8._4_4_ = auVar91._4_4_;
            fStack_11f0 = auVar91._8_4_;
            fStack_11ec = auVar91._12_4_;
            auVar94._0_4_ = fVar86 * (float)local_11f8._0_4_ + fVar116 * auVar72._0_4_;
            auVar94._4_4_ = fVar157 * (float)local_11f8._4_4_ + fVar118 * auVar72._4_4_;
            auVar94._8_4_ = fVar159 * fStack_11f0 + fVar121 * auVar72._8_4_;
            auVar94._12_4_ = fVar161 * fStack_11ec + fVar181 * auVar72._12_4_;
            auVar135._0_4_ = fVar86 * auVar74._0_4_ + fVar116 * auVar106._0_4_;
            auVar135._4_4_ = fVar157 * auVar74._4_4_ + fVar118 * auVar106._4_4_;
            auVar135._8_4_ = fVar159 * auVar74._8_4_ + fVar121 * auVar106._8_4_;
            auVar135._12_4_ = fVar161 * auVar74._12_4_ + fVar181 * auVar106._12_4_;
            auVar108._0_4_ = fVar86 * auVar114._0_4_ + fVar116 * auVar88._0_4_;
            auVar108._4_4_ = fVar157 * auVar114._4_4_ + fVar118 * auVar88._4_4_;
            auVar108._8_4_ = fVar159 * auVar114._8_4_ + fVar121 * auVar88._8_4_;
            auVar108._12_4_ = fVar161 * auVar114._12_4_ + fVar181 * auVar88._12_4_;
            puVar2 = (undefined8 *)(local_12c0 + 0x30 + lVar22);
            local_f88 = *puVar2;
            uStack_f80 = puVar2[1];
            puVar2 = (undefined8 *)(local_12c0 + 0x40 + lVar22);
            local_1258 = auVar58._0_4_;
            fStack_1254 = auVar58._4_4_;
            fStack_1250 = auVar58._8_4_;
            fStack_124c = auVar58._12_4_;
            auVar49._0_4_ = fVar86 * local_1258 + fVar116 * auVar105._0_4_;
            auVar49._4_4_ = fVar157 * fStack_1254 + fVar118 * auVar105._4_4_;
            auVar49._8_4_ = fVar159 * fStack_1250 + fVar121 * auVar105._8_4_;
            auVar49._12_4_ = fVar161 * fStack_124c + fVar181 * auVar105._12_4_;
            local_11e8._0_4_ = auVar93._0_4_;
            local_11e8._4_4_ = auVar93._4_4_;
            fStack_11e0 = auVar93._8_4_;
            fStack_11dc = auVar93._12_4_;
            auVar60._0_4_ = fVar86 * (float)local_11e8._0_4_ + fVar116 * auVar75._0_4_;
            auVar60._4_4_ = fVar157 * (float)local_11e8._4_4_ + fVar118 * auVar75._4_4_;
            auVar60._8_4_ = fVar159 * fStack_11e0 + fVar121 * auVar75._8_4_;
            auVar60._12_4_ = fVar161 * fStack_11dc + fVar181 * auVar75._12_4_;
            local_1268._0_4_ = auVar70._0_4_;
            local_1268._4_4_ = auVar70._4_4_;
            fStack_1260 = auVar70._8_4_;
            fStack_125c = auVar70._12_4_;
            auVar177._0_4_ = fVar86 * (float)local_1268._0_4_ + fVar116 * auVar89._0_4_;
            auVar177._4_4_ = fVar157 * (float)local_1268._4_4_ + fVar118 * auVar89._4_4_;
            auVar177._8_4_ = fVar159 * fStack_1260 + fVar121 * auVar89._8_4_;
            auVar177._12_4_ = fVar161 * fStack_125c + fVar181 * auVar89._12_4_;
            local_12a8._0_4_ = auVar71._0_4_;
            local_12a8._4_4_ = auVar71._4_4_;
            fStack_12a0 = auVar71._8_4_;
            fStack_129c = auVar71._12_4_;
            auVar144._0_4_ = fVar116 * auVar59._0_4_ + fVar86 * (float)local_12a8._0_4_;
            auVar144._4_4_ = fVar118 * auVar59._4_4_ + fVar157 * (float)local_12a8._4_4_;
            auVar144._8_4_ = fVar121 * auVar59._8_4_ + fVar159 * fStack_12a0;
            auVar144._12_4_ = fVar181 * auVar59._12_4_ + fVar161 * fStack_129c;
            local_1148 = *puVar2;
            uStack_1140 = puVar2[1];
            uVar27 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
            auVar155._4_4_ = uVar27;
            auVar155._0_4_ = uVar27;
            auVar155._8_4_ = uVar27;
            auVar155._12_4_ = uVar27;
            uVar27 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 4);
            auVar164._4_4_ = uVar27;
            auVar164._0_4_ = uVar27;
            auVar164._8_4_ = uVar27;
            auVar164._12_4_ = uVar27;
            uVar27 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 8);
            auVar170._4_4_ = uVar27;
            auVar170._0_4_ = uVar27;
            auVar170._8_4_ = uVar27;
            auVar170._12_4_ = uVar27;
            _local_1268 = vsubps_avx(auVar122,auVar155);
            _local_11e8 = vsubps_avx(auVar127,auVar164);
            _local_11f8 = vsubps_avx(auVar94,auVar170);
            auVar47 = vsubps_avx(auVar135,auVar155);
            auVar113 = vsubps_avx(auVar108,auVar164);
            auVar46 = vsubps_avx(auVar49,auVar170);
            auVar114 = vsubps_avx(auVar60,auVar155);
            auVar57 = vsubps_avx(auVar177,auVar164);
            auVar70 = vsubps_avx(auVar144,auVar170);
            local_f98 = vsubps_avx(auVar114,_local_1268);
            local_fa8 = vsubps_avx(auVar57,_local_11e8);
            local_fb8 = vsubps_avx(auVar70,_local_11f8);
            fVar157 = local_11e8._0_4_;
            fVar86 = auVar57._0_4_ + fVar157;
            fVar116 = local_11e8._4_4_;
            fVar97 = auVar57._4_4_ + fVar116;
            fVar181 = local_11e8._8_4_;
            fVar99 = auVar57._8_4_ + fVar181;
            fVar14 = local_11e8._12_4_;
            fVar101 = auVar57._12_4_ + fVar14;
            fVar159 = local_11f8._0_4_;
            fVar103 = auVar70._0_4_ + fVar159;
            fVar118 = local_11f8._4_4_;
            fVar115 = auVar70._4_4_ + fVar118;
            fVar12 = local_11f8._8_4_;
            fVar117 = auVar70._8_4_ + fVar12;
            fVar15 = local_11f8._12_4_;
            fVar119 = auVar70._12_4_ + fVar15;
            fVar69 = local_fb8._0_4_;
            auVar136._0_4_ = fVar69 * fVar86;
            fVar43 = local_fb8._4_4_;
            auVar136._4_4_ = fVar43 * fVar97;
            fVar44 = local_fb8._8_4_;
            auVar136._8_4_ = fVar44 * fVar99;
            fVar45 = local_fb8._12_4_;
            auVar136._12_4_ = fVar45 * fVar101;
            fVar176 = local_fa8._0_4_;
            auVar145._0_4_ = fVar176 * fVar103;
            fVar179 = local_fa8._4_4_;
            auVar145._4_4_ = fVar179 * fVar115;
            fVar180 = local_fa8._8_4_;
            auVar145._8_4_ = fVar180 * fVar117;
            fVar182 = local_fa8._12_4_;
            auVar145._12_4_ = fVar182 * fVar119;
            auVar88 = vsubps_avx(auVar145,auVar136);
            fVar161 = local_1268._0_4_;
            fVar134 = auVar114._0_4_ + fVar161;
            fVar121 = local_1268._4_4_;
            fVar141 = auVar114._4_4_ + fVar121;
            fVar13 = local_1268._8_4_;
            fVar142 = auVar114._8_4_ + fVar13;
            fVar16 = local_1268._12_4_;
            fVar143 = auVar114._12_4_ + fVar16;
            fVar169 = local_f98._0_4_;
            auVar109._0_4_ = fVar169 * fVar103;
            fVar173 = local_f98._4_4_;
            auVar109._4_4_ = fVar173 * fVar115;
            fVar174 = local_f98._8_4_;
            auVar109._8_4_ = fVar174 * fVar117;
            fVar175 = local_f98._12_4_;
            auVar109._12_4_ = fVar175 * fVar119;
            auVar146._0_4_ = fVar134 * fVar69;
            auVar146._4_4_ = fVar141 * fVar43;
            auVar146._8_4_ = fVar142 * fVar44;
            auVar146._12_4_ = fVar143 * fVar45;
            auVar89 = vsubps_avx(auVar146,auVar109);
            auVar137._0_4_ = fVar176 * fVar134;
            auVar137._4_4_ = fVar179 * fVar141;
            auVar137._8_4_ = fVar180 * fVar142;
            auVar137._12_4_ = fVar182 * fVar143;
            auVar95._0_4_ = fVar169 * fVar86;
            auVar95._4_4_ = fVar173 * fVar97;
            auVar95._8_4_ = fVar174 * fVar99;
            auVar95._12_4_ = fVar175 * fVar101;
            auVar58 = vsubps_avx(auVar95,auVar137);
            fStack_1254 = (ray->super_RayK<1>).dir.field_0.m128[2];
            fStack_1294 = (ray->super_RayK<1>).dir.field_0.m128[1];
            fVar86 = (ray->super_RayK<1>).dir.field_0.m128[0];
            local_12a8._0_4_ =
                 auVar88._0_4_ * fVar86 + fStack_1294 * auVar89._0_4_ + fStack_1254 * auVar58._0_4_;
            local_12a8._4_4_ =
                 auVar88._4_4_ * fVar86 + fStack_1294 * auVar89._4_4_ + fStack_1254 * auVar58._4_4_;
            fStack_12a0 = auVar88._8_4_ * fVar86 +
                          fStack_1294 * auVar89._8_4_ + fStack_1254 * auVar58._8_4_;
            fStack_129c = auVar88._12_4_ * fVar86 +
                          fStack_1294 * auVar89._12_4_ + fStack_1254 * auVar58._12_4_;
            local_fc8 = vsubps_avx(_local_11e8,auVar113);
            local_fe8 = vsubps_avx(_local_11f8,auVar46);
            fVar99 = fVar157 + auVar113._0_4_;
            fVar103 = fVar116 + auVar113._4_4_;
            fVar117 = fVar181 + auVar113._8_4_;
            fVar134 = fVar14 + auVar113._12_4_;
            fVar141 = auVar46._0_4_ + fVar159;
            fVar142 = auVar46._4_4_ + fVar118;
            fVar143 = auVar46._8_4_ + fVar12;
            fVar120 = auVar46._12_4_ + fVar15;
            fVar97 = local_fe8._0_4_;
            auVar171._0_4_ = fVar97 * fVar99;
            fVar101 = local_fe8._4_4_;
            auVar171._4_4_ = fVar101 * fVar103;
            fVar115 = local_fe8._8_4_;
            auVar171._8_4_ = fVar115 * fVar117;
            fVar119 = local_fe8._12_4_;
            auVar171._12_4_ = fVar119 * fVar134;
            fVar163 = local_fc8._0_4_;
            auVar76._0_4_ = fVar163 * fVar141;
            fVar166 = local_fc8._4_4_;
            auVar76._4_4_ = fVar166 * fVar142;
            fVar167 = local_fc8._8_4_;
            auVar76._8_4_ = fVar167 * fVar143;
            fVar168 = local_fc8._12_4_;
            auVar76._12_4_ = fVar168 * fVar120;
            auVar88 = vsubps_avx(auVar76,auVar171);
            local_fd8 = vsubps_avx(_local_1268,auVar47);
            fVar149 = local_fd8._0_4_;
            auVar110._0_4_ = fVar149 * fVar141;
            fVar151 = local_fd8._4_4_;
            auVar110._4_4_ = fVar151 * fVar142;
            fVar152 = local_fd8._8_4_;
            auVar110._8_4_ = fVar152 * fVar143;
            fVar153 = local_fd8._12_4_;
            auVar110._12_4_ = fVar153 * fVar120;
            fVar141 = fVar161 + auVar47._0_4_;
            fVar142 = fVar121 + auVar47._4_4_;
            fVar143 = fVar13 + auVar47._8_4_;
            fVar120 = fVar16 + auVar47._12_4_;
            auVar138._0_4_ = fVar97 * fVar141;
            auVar138._4_4_ = fVar101 * fVar142;
            auVar138._8_4_ = fVar115 * fVar143;
            auVar138._12_4_ = fVar119 * fVar120;
            auVar89 = vsubps_avx(auVar138,auVar110);
            auVar128._0_4_ = fVar163 * fVar141;
            auVar128._4_4_ = fVar166 * fVar142;
            auVar128._8_4_ = fVar167 * fVar143;
            auVar128._12_4_ = fVar168 * fVar120;
            auVar96._0_4_ = fVar149 * fVar99;
            auVar96._4_4_ = fVar151 * fVar103;
            auVar96._8_4_ = fVar152 * fVar117;
            auVar96._12_4_ = fVar153 * fVar134;
            auVar58 = vsubps_avx(auVar96,auVar128);
            local_1128._0_4_ =
                 fVar86 * auVar88._0_4_ + fStack_1294 * auVar89._0_4_ + fStack_1254 * auVar58._0_4_;
            local_1128._4_4_ =
                 fVar86 * auVar88._4_4_ + fStack_1294 * auVar89._4_4_ + fStack_1254 * auVar58._4_4_;
            local_1128._8_4_ =
                 fVar86 * auVar88._8_4_ + fStack_1294 * auVar89._8_4_ + fStack_1254 * auVar58._8_4_;
            local_1128._12_4_ =
                 fVar86 * auVar88._12_4_ +
                 fStack_1294 * auVar89._12_4_ + fStack_1254 * auVar58._12_4_;
            auVar88 = vsubps_avx(auVar47,auVar114);
            fVar68 = auVar47._0_4_ + auVar114._0_4_;
            fVar83 = auVar47._4_4_ + auVar114._4_4_;
            fVar84 = auVar47._8_4_ + auVar114._8_4_;
            fVar85 = auVar47._12_4_ + auVar114._12_4_;
            auVar47 = vsubps_avx(auVar113,auVar57);
            fVar141 = auVar113._0_4_ + auVar57._0_4_;
            fVar142 = auVar113._4_4_ + auVar57._4_4_;
            fVar143 = auVar113._8_4_ + auVar57._8_4_;
            fVar120 = auVar113._12_4_ + auVar57._12_4_;
            auVar113 = vsubps_avx(auVar46,auVar70);
            fVar99 = auVar46._0_4_ + auVar70._0_4_;
            fVar103 = auVar46._4_4_ + auVar70._4_4_;
            fVar117 = auVar46._8_4_ + auVar70._8_4_;
            fVar134 = auVar46._12_4_ + auVar70._12_4_;
            fVar87 = auVar113._0_4_;
            auVar50._0_4_ = fVar87 * fVar141;
            fVar98 = auVar113._4_4_;
            auVar50._4_4_ = fVar98 * fVar142;
            fVar100 = auVar113._8_4_;
            auVar50._8_4_ = fVar100 * fVar143;
            fVar102 = auVar113._12_4_;
            auVar50._12_4_ = fVar102 * fVar120;
            fVar154 = auVar47._0_4_;
            auVar129._0_4_ = fVar154 * fVar99;
            fVar158 = auVar47._4_4_;
            auVar129._4_4_ = fVar158 * fVar103;
            fVar160 = auVar47._8_4_;
            auVar129._8_4_ = fVar160 * fVar117;
            fVar162 = auVar47._12_4_;
            auVar129._12_4_ = fVar162 * fVar134;
            auVar47 = vsubps_avx(auVar129,auVar50);
            fVar104 = auVar88._0_4_;
            auVar36._0_4_ = fVar104 * fVar99;
            fVar99 = auVar88._4_4_;
            auVar36._4_4_ = fVar99 * fVar103;
            fVar103 = auVar88._8_4_;
            auVar36._8_4_ = fVar103 * fVar117;
            fVar117 = auVar88._12_4_;
            auVar36._12_4_ = fVar117 * fVar134;
            auVar130._0_4_ = fVar87 * fVar68;
            auVar130._4_4_ = fVar98 * fVar83;
            auVar130._8_4_ = fVar100 * fVar84;
            auVar130._12_4_ = fVar102 * fVar85;
            auVar113 = vsubps_avx(auVar130,auVar36);
            auVar77._0_4_ = fVar154 * fVar68;
            auVar77._4_4_ = fVar158 * fVar83;
            auVar77._8_4_ = fVar160 * fVar84;
            auVar77._12_4_ = fVar162 * fVar85;
            auVar61._0_4_ = fVar104 * fVar141;
            auVar61._4_4_ = fVar99 * fVar142;
            auVar61._8_4_ = fVar103 * fVar143;
            auVar61._12_4_ = fVar117 * fVar120;
            auVar46 = vsubps_avx(auVar61,auVar77);
            local_1258 = fStack_1254;
            fStack_1250 = fStack_1254;
            fStack_124c = fStack_1254;
            local_1298 = fStack_1294;
            fStack_1290 = fStack_1294;
            fStack_128c = fStack_1294;
            auVar37._0_4_ =
                 fVar86 * auVar47._0_4_ + fStack_1294 * auVar113._0_4_ + fStack_1254 * auVar46._0_4_
            ;
            auVar37._4_4_ =
                 fVar86 * auVar47._4_4_ + fStack_1294 * auVar113._4_4_ + fStack_1254 * auVar46._4_4_
            ;
            auVar37._8_4_ =
                 fVar86 * auVar47._8_4_ + fStack_1294 * auVar113._8_4_ + fStack_1254 * auVar46._8_4_
            ;
            auVar37._12_4_ =
                 fVar86 * auVar47._12_4_ +
                 fStack_1294 * auVar113._12_4_ + fStack_1254 * auVar46._12_4_;
            local_1118._0_4_ = auVar37._0_4_ + (float)local_12a8._0_4_ + local_1128._0_4_;
            local_1118._4_4_ = auVar37._4_4_ + (float)local_12a8._4_4_ + local_1128._4_4_;
            local_1118._8_4_ = auVar37._8_4_ + fStack_12a0 + local_1128._8_4_;
            local_1118._12_4_ = auVar37._12_4_ + fStack_129c + local_1128._12_4_;
            auVar47 = vminps_avx(_local_12a8,local_1128);
            auVar113 = vminps_avx(auVar47,auVar37);
            auVar62._8_4_ = 0x7fffffff;
            auVar62._0_8_ = 0x7fffffff7fffffff;
            auVar62._12_4_ = 0x7fffffff;
            auVar47 = vandps_avx(local_1118,auVar62);
            auVar63._0_4_ = auVar47._0_4_ * 1.1920929e-07;
            auVar63._4_4_ = auVar47._4_4_ * 1.1920929e-07;
            auVar63._8_4_ = auVar47._8_4_ * 1.1920929e-07;
            auVar63._12_4_ = auVar47._12_4_ * 1.1920929e-07;
            uVar23 = CONCAT44(auVar63._4_4_,auVar63._0_4_);
            auVar78._0_8_ = uVar23 ^ 0x8000000080000000;
            auVar78._8_4_ = -auVar63._8_4_;
            auVar78._12_4_ = -auVar63._12_4_;
            auVar113 = vcmpps_avx(auVar113,auVar78,5);
            auVar46 = vmaxps_avx(_local_12a8,local_1128);
            auVar46 = vmaxps_avx(auVar46,auVar37);
            auVar46 = vcmpps_avx(auVar46,auVar63,2);
            local_ff8 = vorps_avx(auVar113,auVar46);
            local_12c1 = 0;
            local_1108 = &local_12c1;
            auVar17._8_8_ = uStack_1150;
            auVar17._0_8_ = local_1158;
            auVar17 = auVar17 & local_ff8;
            if ((((auVar17 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar17 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar17 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar17[0xf] < '\0') {
              auVar38._0_4_ = fVar69 * fVar163;
              auVar38._4_4_ = fVar43 * fVar166;
              auVar38._8_4_ = fVar44 * fVar167;
              auVar38._12_4_ = fVar45 * fVar168;
              auVar51._0_4_ = fVar176 * fVar97;
              auVar51._4_4_ = fVar179 * fVar101;
              auVar51._8_4_ = fVar180 * fVar115;
              auVar51._12_4_ = fVar182 * fVar119;
              auVar114 = vsubps_avx(auVar51,auVar38);
              auVar64._0_4_ = fVar97 * fVar154;
              auVar64._4_4_ = fVar101 * fVar158;
              auVar64._8_4_ = fVar115 * fVar160;
              auVar64._12_4_ = fVar119 * fVar162;
              auVar79._0_4_ = fVar163 * fVar87;
              auVar79._4_4_ = fVar166 * fVar98;
              auVar79._8_4_ = fVar167 * fVar100;
              auVar79._12_4_ = fVar168 * fVar102;
              auVar57 = vsubps_avx(auVar79,auVar64);
              auVar131._8_4_ = 0x7fffffff;
              auVar131._0_8_ = 0x7fffffff7fffffff;
              auVar131._12_4_ = 0x7fffffff;
              auVar113 = vandps_avx(auVar38,auVar131);
              auVar46 = vandps_avx(auVar64,auVar131);
              auVar113 = vcmpps_avx(auVar113,auVar46,1);
              local_10b8 = vblendvps_avx(auVar57,auVar114,auVar113);
              auVar52._0_4_ = fVar149 * fVar87;
              auVar52._4_4_ = fVar151 * fVar98;
              auVar52._8_4_ = fVar152 * fVar100;
              auVar52._12_4_ = fVar153 * fVar102;
              auVar65._0_4_ = fVar69 * fVar149;
              auVar65._4_4_ = fVar43 * fVar151;
              auVar65._8_4_ = fVar44 * fVar152;
              auVar65._12_4_ = fVar45 * fVar153;
              auVar80._0_4_ = fVar169 * fVar97;
              auVar80._4_4_ = fVar173 * fVar101;
              auVar80._8_4_ = fVar174 * fVar115;
              auVar80._12_4_ = fVar175 * fVar119;
              auVar114 = vsubps_avx(auVar65,auVar80);
              auVar123._0_4_ = fVar97 * fVar104;
              auVar123._4_4_ = fVar101 * fVar99;
              auVar123._8_4_ = fVar115 * fVar103;
              auVar123._12_4_ = fVar119 * fVar117;
              auVar57 = vsubps_avx(auVar123,auVar52);
              auVar113 = vandps_avx(auVar80,auVar131);
              auVar46 = vandps_avx(auVar52,auVar131);
              auVar113 = vcmpps_avx(auVar113,auVar46,1);
              local_10a8 = vblendvps_avx(auVar57,auVar114,auVar113);
              auVar66._0_4_ = fVar163 * fVar104;
              auVar66._4_4_ = fVar166 * fVar99;
              auVar66._8_4_ = fVar167 * fVar103;
              auVar66._12_4_ = fVar168 * fVar117;
              auVar81._0_4_ = fVar169 * fVar163;
              auVar81._4_4_ = fVar173 * fVar166;
              auVar81._8_4_ = fVar174 * fVar167;
              auVar81._12_4_ = fVar175 * fVar168;
              auVar111._0_4_ = fVar176 * fVar149;
              auVar111._4_4_ = fVar179 * fVar151;
              auVar111._8_4_ = fVar180 * fVar152;
              auVar111._12_4_ = fVar182 * fVar153;
              auVar124._0_4_ = fVar149 * fVar154;
              auVar124._4_4_ = fVar151 * fVar158;
              auVar124._8_4_ = fVar152 * fVar160;
              auVar124._12_4_ = fVar153 * fVar162;
              auVar114 = vsubps_avx(auVar81,auVar111);
              auVar57 = vsubps_avx(auVar124,auVar66);
              auVar113 = vandps_avx(auVar111,auVar131);
              auVar46 = vandps_avx(auVar66,auVar131);
              auVar113 = vcmpps_avx(auVar113,auVar46,1);
              local_1098 = vblendvps_avx(auVar57,auVar114,auVar113);
              fVar69 = local_10b8._0_4_ * fVar86 +
                       local_10a8._0_4_ * fStack_1294 + local_1098._0_4_ * fStack_1254;
              fVar97 = local_10b8._4_4_ * fVar86 +
                       local_10a8._4_4_ * fStack_1294 + local_1098._4_4_ * fStack_1254;
              fVar99 = local_10b8._8_4_ * fVar86 +
                       local_10a8._8_4_ * fStack_1294 + local_1098._8_4_ * fStack_1254;
              fVar86 = local_10b8._12_4_ * fVar86 +
                       local_10a8._12_4_ * fStack_1294 + local_1098._12_4_ * fStack_1254;
              auVar82._0_4_ = fVar69 + fVar69;
              auVar82._4_4_ = fVar97 + fVar97;
              auVar82._8_4_ = fVar99 + fVar99;
              auVar82._12_4_ = fVar86 + fVar86;
              fVar69 = local_10b8._0_4_ * fVar161 +
                       local_10a8._0_4_ * fVar157 + local_1098._0_4_ * fVar159;
              fVar116 = local_10b8._4_4_ * fVar121 +
                        local_10a8._4_4_ * fVar116 + local_1098._4_4_ * fVar118;
              fVar118 = local_10b8._8_4_ * fVar13 +
                        local_10a8._8_4_ * fVar181 + local_1098._8_4_ * fVar12;
              fVar121 = local_10b8._12_4_ * fVar16 +
                        local_10a8._12_4_ * fVar14 + local_1098._12_4_ * fVar15;
              auVar113 = vrcpps_avx(auVar82);
              fVar86 = auVar113._0_4_;
              auVar132._0_4_ = auVar82._0_4_ * fVar86;
              fVar157 = auVar113._4_4_;
              auVar132._4_4_ = auVar82._4_4_ * fVar157;
              fVar159 = auVar113._8_4_;
              auVar132._8_4_ = auVar82._8_4_ * fVar159;
              fVar161 = auVar113._12_4_;
              auVar132._12_4_ = auVar82._12_4_ * fVar161;
              auVar139._8_4_ = 0x3f800000;
              auVar139._0_8_ = &DAT_3f8000003f800000;
              auVar139._12_4_ = 0x3f800000;
              auVar113 = vsubps_avx(auVar139,auVar132);
              local_1288._0_4_ = (fVar69 + fVar69) * (fVar86 + fVar86 * auVar113._0_4_);
              local_1288._4_4_ = (fVar116 + fVar116) * (fVar157 + fVar157 * auVar113._4_4_);
              local_1288._8_4_ = (fVar118 + fVar118) * (fVar159 + fVar159 * auVar113._8_4_);
              local_1288._12_4_ = (fVar121 + fVar121) * (fVar161 + fVar161 * auVar113._12_4_);
              uVar27 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
              auVar112._4_4_ = uVar27;
              auVar112._0_4_ = uVar27;
              auVar112._8_4_ = uVar27;
              auVar112._12_4_ = uVar27;
              auVar113 = vcmpps_avx(auVar112,local_1288,2);
              fVar86 = (ray->super_RayK<1>).tfar;
              auVar125._4_4_ = fVar86;
              auVar125._0_4_ = fVar86;
              auVar125._8_4_ = fVar86;
              auVar125._12_4_ = fVar86;
              auVar46 = vcmpps_avx(local_1288,auVar125,2);
              auVar113 = vandps_avx(auVar113,auVar46);
              auVar46 = vcmpps_avx(auVar82,_DAT_01feba10,4);
              auVar113 = vandps_avx(auVar46,auVar113);
              auVar18._8_8_ = uStack_1150;
              auVar18._0_8_ = local_1158;
              auVar46 = vandps_avx(local_ff8,auVar18);
              auVar113 = vpslld_avx(auVar113,0x1f);
              auVar114 = vpsrad_avx(auVar113,0x1f);
              auVar113 = auVar46 & auVar114;
              if ((((auVar113 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar113 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar113 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar113[0xf] < '\0') {
                auVar113 = vandps_avx(auVar114,auVar46);
                local_1138 = _local_12a8;
                local_10f8 = auVar113;
                local_10c8 = local_1288;
                local_1248 = auVar113;
                auVar46 = vrcpps_avx(local_1118);
                fVar86 = auVar46._0_4_;
                auVar53._0_4_ = local_1118._0_4_ * fVar86;
                fVar157 = auVar46._4_4_;
                auVar53._4_4_ = local_1118._4_4_ * fVar157;
                fVar159 = auVar46._8_4_;
                auVar53._8_4_ = local_1118._8_4_ * fVar159;
                fVar161 = auVar46._12_4_;
                auVar53._12_4_ = local_1118._12_4_ * fVar161;
                auVar67._8_4_ = 0x3f800000;
                auVar67._0_8_ = &DAT_3f8000003f800000;
                auVar67._12_4_ = 0x3f800000;
                auVar46 = vsubps_avx(auVar67,auVar53);
                auVar39._0_4_ = fVar86 + fVar86 * auVar46._0_4_;
                auVar39._4_4_ = fVar157 + fVar157 * auVar46._4_4_;
                auVar39._8_4_ = fVar159 + fVar159 * auVar46._8_4_;
                auVar39._12_4_ = fVar161 + fVar161 * auVar46._12_4_;
                auVar54._8_4_ = 0x219392ef;
                auVar54._0_8_ = 0x219392ef219392ef;
                auVar54._12_4_ = 0x219392ef;
                auVar47 = vcmpps_avx(auVar47,auVar54,5);
                auVar47 = vandps_avx(auVar47,auVar39);
                auVar55._0_4_ = (float)local_12a8._0_4_ * auVar47._0_4_;
                auVar55._4_4_ = (float)local_12a8._4_4_ * auVar47._4_4_;
                auVar55._8_4_ = fStack_12a0 * auVar47._8_4_;
                auVar55._12_4_ = fStack_129c * auVar47._12_4_;
                local_10e8 = vminps_avx(auVar55,auVar67);
                auVar40._0_4_ = local_1128._0_4_ * auVar47._0_4_;
                auVar40._4_4_ = local_1128._4_4_ * auVar47._4_4_;
                auVar40._8_4_ = local_1128._8_4_ * auVar47._8_4_;
                auVar40._12_4_ = local_1128._12_4_ * auVar47._12_4_;
                local_10d8 = vminps_avx(auVar40,auVar67);
                auVar41._8_4_ = 0x7f800000;
                auVar41._0_8_ = 0x7f8000007f800000;
                auVar41._12_4_ = 0x7f800000;
                auVar47 = vblendvps_avx(auVar41,local_1288,auVar113);
                auVar46 = vshufps_avx(auVar47,auVar47,0xb1);
                auVar46 = vminps_avx(auVar46,auVar47);
                auVar114 = vshufpd_avx(auVar46,auVar46,1);
                auVar46 = vminps_avx(auVar114,auVar46);
                auVar47 = vcmpps_avx(auVar47,auVar46,0);
                auVar46 = auVar113 & auVar47;
                if ((((auVar46 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar46 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar46 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    auVar46[0xf] < '\0') {
                  auVar113 = vandps_avx(auVar47,auVar113);
                }
                uVar27 = vmovmskps_avx(auVar113);
                uVar23 = CONCAT44((int)((ulong)&local_12c1 >> 0x20),uVar27);
                piVar35 = (int *)0x0;
                if (uVar23 != 0) {
                  for (; (uVar23 >> (long)piVar35 & 1) == 0; piVar35 = (int *)((long)piVar35 + 1)) {
                  }
                }
                do {
                  uVar6 = *(uint *)((long)&local_f88 + (long)piVar35 * 4);
                  pGVar8 = (pSVar7->geometries).items[uVar6].ptr;
                  if ((pGVar8->mask & (ray->super_RayK<1>).mask) == 0) {
                    *(undefined4 *)(local_1248 + (long)piVar35 * 4) = 0;
                  }
                  else {
                    pRVar9 = context->args;
                    if ((pRVar9->filter == (RTCFilterFunctionN)0x0) &&
                       (pGVar8->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                      fVar86 = *(float *)(local_10e8 + (long)piVar35 * 4);
                      fVar157 = *(float *)(local_10d8 + (long)piVar35 * 4);
                      (ray->super_RayK<1>).tfar = *(float *)(local_10c8 + (long)piVar35 * 4);
                      (ray->Ng).field_0.field_0.x = *(float *)(local_10b8 + (long)piVar35 * 4);
                      (ray->Ng).field_0.field_0.y = *(float *)(local_10a8 + (long)piVar35 * 4);
                      (ray->Ng).field_0.field_0.z = *(float *)(local_1098 + (long)piVar35 * 4);
                      ray->u = fVar86;
                      ray->v = fVar157;
                      ray->primID = *(uint *)((long)&local_1148 + (long)piVar35 * 4);
                      ray->geomID = uVar6;
                      pRVar10 = context->user;
                      ray->instID[0] = pRVar10->instID[0];
                      ray->instPrimID[0] = pRVar10->instPrimID[0];
                      break;
                    }
                    local_1228.context = context->user;
                    local_1198 = *(float *)(local_10b8 + (long)piVar35 * 4);
                    local_1194 = *(undefined4 *)(local_10a8 + (long)piVar35 * 4);
                    local_1190 = *(undefined4 *)(local_1098 + (long)piVar35 * 4);
                    local_118c = *(undefined4 *)(local_10e8 + (long)piVar35 * 4);
                    local_1188 = *(undefined4 *)(local_10d8 + (long)piVar35 * 4);
                    local_1184 = *(undefined4 *)((long)&local_1148 + (long)piVar35 * 4);
                    local_1180 = uVar6;
                    local_117c = (local_1228.context)->instID[0];
                    local_1178 = (local_1228.context)->instPrimID[0];
                    local_1298 = (ray->super_RayK<1>).tfar;
                    (ray->super_RayK<1>).tfar = *(float *)(local_10c8 + (long)piVar35 * 4);
                    local_126c = -1;
                    local_1228.valid = &local_126c;
                    local_1228.geometryUserPtr = pGVar8->userPtr;
                    local_1228.ray = (RTCRayN *)ray;
                    local_1228.hit = (RTCHitN *)&local_1198;
                    local_1228.N = 1;
                    if ((pGVar8->intersectionFilterN == (RTCFilterFunctionN)0x0) ||
                       ((*pGVar8->intersectionFilterN)(&local_1228), *local_1228.valid != 0)) {
                      if (pRVar9->filter != (RTCFilterFunctionN)0x0) {
                        if (((pRVar9->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                           (((pGVar8->field_8).field_0x2 & 0x40) != 0)) {
                          (*pRVar9->filter)(&local_1228);
                        }
                        if (*local_1228.valid == 0) goto LAB_012b5ec8;
                      }
                      (((Vec3f *)((long)local_1228.ray + 0x30))->field_0).field_0.x =
                           *(float *)local_1228.hit;
                      (((Vec3f *)((long)local_1228.ray + 0x30))->field_0).field_0.y =
                           *(float *)(local_1228.hit + 4);
                      (((Vec3f *)((long)local_1228.ray + 0x30))->field_0).field_0.z =
                           *(float *)(local_1228.hit + 8);
                      *(float *)((long)local_1228.ray + 0x3c) = *(float *)(local_1228.hit + 0xc);
                      *(float *)((long)local_1228.ray + 0x40) = *(float *)(local_1228.hit + 0x10);
                      *(float *)((long)local_1228.ray + 0x44) = *(float *)(local_1228.hit + 0x14);
                      *(float *)((long)local_1228.ray + 0x48) = *(float *)(local_1228.hit + 0x18);
                      *(float *)((long)local_1228.ray + 0x4c) = *(float *)(local_1228.hit + 0x1c);
                      *(float *)((long)local_1228.ray + 0x50) = *(float *)(local_1228.hit + 0x20);
                    }
                    else {
LAB_012b5ec8:
                      (ray->super_RayK<1>).tfar = local_1298;
                    }
                    *(undefined4 *)(local_1248 + (long)piVar35 * 4) = 0;
                    fVar86 = (ray->super_RayK<1>).tfar;
                    auVar56._4_4_ = fVar86;
                    auVar56._0_4_ = fVar86;
                    auVar56._8_4_ = fVar86;
                    auVar56._12_4_ = fVar86;
                    auVar47 = vcmpps_avx(local_1288,auVar56,2);
                    local_1248 = vandps_avx(auVar47,local_1248);
                  }
                  if ((((local_1248 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                       (local_1248 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      (local_1248 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      -1 < local_1248[0xf]) break;
                  BVHNIntersector1<4,16777232,true,embree::avx::ArrayIntersector1<embree::avx::TriangleMiMBIntersector1Pluecker<4,true>>>
                  ::intersect(&local_1228);
                  piVar35 = local_1228.valid;
                } while( true );
              }
            }
            local_11a0 = local_11a0 + 1;
          } while (local_11a0 != local_11a8);
        }
        fVar86 = (ray->super_RayK<1>).tfar;
        auVar42 = ZEXT1664(CONCAT412(fVar86,CONCAT48(fVar86,CONCAT44(fVar86,fVar86))));
        auVar133 = ZEXT1664(local_1008);
        auVar140 = ZEXT1664(local_1018);
        auVar147 = ZEXT1664(local_1028);
        auVar148 = ZEXT1664(local_1038);
        auVar150 = ZEXT1664(local_1048);
        auVar156 = ZEXT1664(local_1058);
        auVar165 = ZEXT1664(local_1068);
        auVar172 = ZEXT1664(local_1078);
        auVar178 = ZEXT1664(local_1088);
        auVar126 = ZEXT1664(local_1168);
        uVar23 = local_11c0;
        uVar25 = local_11d8;
        uVar26 = local_12b0;
        This = local_12b8;
        uVar29 = local_11b8;
        uVar30 = local_11d0;
        uVar31 = local_11c8;
      } while( true );
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }